

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3AtoF(char *z,double *pResult,int length,u8 enc)

{
  ulong uVar1;
  char *pcVar2;
  byte bVar3;
  bool bVar4;
  float fVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  undefined7 in_register_00000009;
  byte *pbVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  byte *pbVar15;
  int iVar16;
  long lVar17;
  bool bVar18;
  double dVar19;
  
  *pResult = 0.0;
  uVar8 = (uint)CONCAT71(in_register_00000009,enc);
  if (uVar8 == 1) {
    uVar8 = 1;
    lVar17 = 1;
    pbVar11 = (byte *)z;
  }
  else {
    uVar9 = 3 - uVar8;
    uVar7 = (ulong)uVar9;
    bVar18 = length <= (int)uVar9;
    if (((int)uVar9 < length) &&
       (uVar7 = 3 - (CONCAT71(in_register_00000009,enc) & 0xffffffff), z[uVar7] == '\0')) {
      uVar7 = 5 - (ulong)enc;
      do {
        bVar18 = (long)length <= (long)uVar7;
        if ((long)length <= (long)uVar7) goto LAB_0012d0a2;
        uVar1 = uVar7 + 2;
        pcVar2 = z + uVar7;
        uVar7 = uVar1;
      } while (*pcVar2 == '\0');
      uVar7 = (ulong)((int)uVar1 - 2);
    }
LAB_0012d0a2:
    length = (uint)uVar7 ^ 1;
    pbVar11 = (byte *)(z + (uVar8 & 1));
    uVar8 = (uint)bVar18;
    lVar17 = 2;
  }
  pbVar15 = (byte *)(z + length);
  bVar18 = pbVar11 < pbVar15;
  if (!bVar18) {
    return 0;
  }
  bVar3 = *pbVar11;
  while ((""[bVar3] & 1) != 0) {
    pbVar11 = pbVar11 + lVar17;
    bVar18 = pbVar11 < pbVar15;
    if (!bVar18) {
      return 0;
    }
    bVar3 = *pbVar11;
  }
  if (!bVar18) {
    return 0;
  }
  bVar3 = *pbVar11;
  iVar6 = 0;
  lVar12 = 0;
  if ((bVar3 - 0x2b & 0xfd) == 0) {
    lVar12 = lVar17;
  }
  pbVar11 = pbVar11 + lVar12;
  if (pbVar11 < pbVar15) {
    iVar16 = 0;
    lVar12 = 0;
    do {
      if ((9 < (ulong)*pbVar11 - 0x30) || (0xcccccccccccccca < lVar12)) break;
      lVar12 = (long)(char)*pbVar11 + lVar12 * 10 + -0x30;
      pbVar11 = pbVar11 + lVar17;
      iVar16 = iVar16 + 1;
    } while (pbVar11 < pbVar15);
  }
  else {
    lVar12 = 0;
    iVar16 = 0;
  }
  iVar10 = 1;
  bVar18 = pbVar11 < pbVar15;
  if (bVar18) {
    if ((ulong)*pbVar11 - 0x3a < 0xfffffffffffffff6) {
      iVar6 = 0;
    }
    else {
      iVar13 = 0;
      do {
        pbVar11 = pbVar11 + lVar17;
        iVar6 = iVar13 + 1;
        bVar18 = pbVar11 < pbVar15;
        if (!bVar18) {
          iVar16 = iVar16 + iVar13 + 1;
          goto LAB_0012d261;
        }
        iVar13 = iVar6;
      } while (0xfffffffffffffff5 < (ulong)*pbVar11 - 0x3a);
      iVar16 = iVar16 + iVar6;
    }
    if (bVar18) {
      if (*pbVar11 == 0x2e) {
        while ((pbVar11 = pbVar11 + lVar17, pbVar11 < pbVar15 &&
               (0xfffffffffffffff5 < (ulong)*pbVar11 - 0x3a))) {
          if (lVar12 < 0xccccccccccccccb) {
            lVar12 = (long)(char)*pbVar11 + lVar12 * 10 + -0x30;
            iVar6 = iVar6 + -1;
          }
          iVar16 = iVar16 + 1;
        }
      }
      if (pbVar11 < pbVar15) {
        if ((*pbVar11 | 0x20) == 0x65) {
          pbVar11 = pbVar11 + lVar17;
          if (pbVar15 <= pbVar11) {
            iVar13 = 0;
            iVar10 = 1;
            bVar18 = false;
            goto LAB_0012d266;
          }
          iVar10 = 1;
          if (*pbVar11 == 0x2b) {
            pbVar11 = pbVar11 + lVar17;
          }
          else if (*pbVar11 == 0x2d) {
            pbVar11 = pbVar11 + lVar17;
            iVar10 = -1;
          }
          iVar13 = 0;
          if (pbVar11 < pbVar15) {
            uVar7 = (ulong)*pbVar11;
            if (uVar7 - 0x3a < 0xfffffffffffffff6) {
              bVar18 = false;
            }
            else {
              bVar18 = true;
              iVar14 = 0;
              do {
                pbVar11 = pbVar11 + lVar17;
                iVar13 = (char)uVar7 + -0x30 + iVar14 * 10;
                if (9999 < iVar14) {
                  iVar13 = 10000;
                }
              } while ((pbVar11 < pbVar15) &&
                      (uVar7 = (ulong)*pbVar11, iVar14 = iVar13, 0xfffffffffffffff5 < uVar7 - 0x3a))
              ;
            }
          }
          else {
            bVar18 = false;
          }
        }
        else {
          iVar13 = 0;
          iVar10 = 1;
          bVar18 = true;
        }
        while ((pbVar11 < pbVar15 && ((""[*pbVar11] & 1) != 0))) {
          pbVar11 = pbVar11 + lVar17;
        }
        goto LAB_0012d266;
      }
    }
  }
LAB_0012d261:
  iVar13 = 0;
  bVar18 = true;
LAB_0012d266:
  if (lVar12 == 0) {
    if (bVar3 == 0x2d) {
      dVar19 = -0.0;
    }
    else {
      dVar19 = 0.0;
    }
  }
  else {
    iVar6 = iVar13 * iVar10 + iVar6;
    iVar10 = -iVar6;
    if (0 < iVar6) {
      iVar10 = iVar6;
    }
    iVar13 = iVar10;
    if (iVar6 != 0) {
      do {
        iVar13 = iVar10;
        if (iVar6 < 0) {
          uVar7 = lVar12 * -0x3333333333333333 + 0x1999999999999998;
          if (0x1999999999999998 < (uVar7 >> 1 | (ulong)((uVar7 & 1) != 0) << 0x3f)) break;
          lVar12 = lVar12 / 10;
        }
        else {
          if (0xccccccccccccccb < lVar12) break;
          lVar12 = lVar12 * 10;
        }
        iVar13 = iVar10 + -1;
        bVar4 = 1 < iVar10;
        iVar10 = iVar13;
      } while (bVar4);
    }
    lVar17 = -lVar12;
    if (bVar3 != 0x2d) {
      lVar17 = lVar12;
    }
    if (iVar13 == 0) {
      dVar19 = (double)lVar17;
    }
    else if (iVar13 < 0x134) {
      uVar9 = iVar13 * -0x45d1745d + 0xba2e8ba;
      fVar5 = 1.0;
      if (0xba2e8ba < (uVar9 >> 1 | (uint)((uVar9 & 1) != 0) << 0x1f)) {
        fVar5 = 1.0;
        do {
          fVar5 = fVar5 * 10.0;
          iVar10 = iVar13 * -0x45d1745d;
          iVar13 = iVar13 + -1;
          uVar9 = iVar10 + 0x51745d17;
        } while (0xba2e8ba < (uVar9 >> 1 | (uint)((uVar9 & 1) != 0) << 0x1f));
      }
      if (0 < iVar13) {
        iVar13 = iVar13 + 0x16;
        do {
          fVar5 = fVar5 * 1e+22;
          iVar13 = iVar13 + -0x16;
        } while (0x16 < iVar13);
      }
      if (iVar6 < 0) {
        dVar19 = (double)((float)lVar17 / fVar5);
      }
      else {
        dVar19 = (double)((float)lVar17 * fVar5);
      }
    }
    else if (iVar13 < 0x156) {
      fVar5 = 1.0;
      if (0xd4c77b < ((uint)(iVar13 * 0x3f2b3885) >> 2 | iVar13 * 0x40000000)) {
        fVar5 = 1.0;
        do {
          iVar13 = iVar13 + -1;
          fVar5 = fVar5 * 10.0;
        } while (0xd4c77a < (iVar13 * 0x3f2b3885 + 0x1a98ef4U >> 2 | iVar13 * 0x40000000));
      }
      if (iVar6 < 0) {
        dVar19 = (double)((float)lVar17 / fVar5) / 1e+308;
      }
      else {
        dVar19 = (double)((float)lVar17 * fVar5) * 1e+308;
      }
    }
    else if (iVar6 < 0) {
      dVar19 = (double)((ulong)(double)lVar17 & 0x8000000000000000);
    }
    else {
      dVar19 = (double)lVar17 * INFINITY;
    }
  }
  if (iVar16 < 1) {
    uVar8 = 0;
  }
  *pResult = dVar19;
  if (pbVar11 != pbVar15) {
    uVar8 = 0;
  }
  if (!bVar18) {
    uVar8 = 0;
  }
  return uVar8;
}

Assistant:

SQLITE_PRIVATE int sqlite3AtoF(const char *z, double *pResult, int length, u8 enc){
#ifndef SQLITE_OMIT_FLOATING_POINT
  int incr;
  const char *zEnd = z + length;
  /* sign * significand * (10 ^ (esign * exponent)) */
  int sign = 1;    /* sign of significand */
  i64 s = 0;       /* significand */
  int d = 0;       /* adjust exponent for shifting decimal point */
  int esign = 1;   /* sign of exponent */
  int e = 0;       /* exponent */
  int eValid = 1;  /* True exponent is either not used or is well-formed */
  double result;
  int nDigits = 0;
  int nonNum = 0;  /* True if input contains UTF16 with high byte non-zero */

  assert( enc==SQLITE_UTF8 || enc==SQLITE_UTF16LE || enc==SQLITE_UTF16BE );
  *pResult = 0.0;   /* Default return value, in case of an error */

  if( enc==SQLITE_UTF8 ){
    incr = 1;
  }else{
    int i;
    incr = 2;
    assert( SQLITE_UTF16LE==2 && SQLITE_UTF16BE==3 );
    for(i=3-enc; i<length && z[i]==0; i+=2){}
    nonNum = i<length;
    zEnd = &z[i^1];
    z += (enc&1);
  }

  /* skip leading spaces */
  while( z<zEnd && sqlite3Isspace(*z) ) z+=incr;
  if( z>=zEnd ) return 0;

  /* get sign of significand */
  if( *z=='-' ){
    sign = -1;
    z+=incr;
  }else if( *z=='+' ){
    z+=incr;
  }

  /* copy max significant digits to significand */
  while( z<zEnd && sqlite3Isdigit(*z) && s<((LARGEST_INT64-9)/10) ){
    s = s*10 + (*z - '0');
    z+=incr, nDigits++;
  }

  /* skip non-significant significand digits
  ** (increase exponent by d to shift decimal left) */
  while( z<zEnd && sqlite3Isdigit(*z) ) z+=incr, nDigits++, d++;
  if( z>=zEnd ) goto do_atof_calc;

  /* if decimal point is present */
  if( *z=='.' ){
    z+=incr;
    /* copy digits from after decimal to significand
    ** (decrease exponent by d to shift decimal right) */
    while( z<zEnd && sqlite3Isdigit(*z) ){
      if( s<((LARGEST_INT64-9)/10) ){
        s = s*10 + (*z - '0');
        d--;
      }
      z+=incr, nDigits++;
    }
  }
  if( z>=zEnd ) goto do_atof_calc;

  /* if exponent is present */
  if( *z=='e' || *z=='E' ){
    z+=incr;
    eValid = 0;

    /* This branch is needed to avoid a (harmless) buffer overread.  The 
    ** special comment alerts the mutation tester that the correct answer
    ** is obtained even if the branch is omitted */
    if( z>=zEnd ) goto do_atof_calc;              /*PREVENTS-HARMLESS-OVERREAD*/

    /* get sign of exponent */
    if( *z=='-' ){
      esign = -1;
      z+=incr;
    }else if( *z=='+' ){
      z+=incr;
    }
    /* copy digits to exponent */
    while( z<zEnd && sqlite3Isdigit(*z) ){
      e = e<10000 ? (e*10 + (*z - '0')) : 10000;
      z+=incr;
      eValid = 1;
    }
  }

  /* skip trailing spaces */
  while( z<zEnd && sqlite3Isspace(*z) ) z+=incr;

do_atof_calc:
  /* adjust exponent by d, and update sign */
  e = (e*esign) + d;
  if( e<0 ) {
    esign = -1;
    e *= -1;
  } else {
    esign = 1;
  }

  if( s==0 ) {
    /* In the IEEE 754 standard, zero is signed. */
    result = sign<0 ? -(double)0 : (double)0;
  } else {
    /* Attempt to reduce exponent.
    **
    ** Branches that are not required for the correct answer but which only
    ** help to obtain the correct answer faster are marked with special
    ** comments, as a hint to the mutation tester.
    */
    while( e>0 ){                                       /*OPTIMIZATION-IF-TRUE*/
      if( esign>0 ){
        if( s>=(LARGEST_INT64/10) ) break;             /*OPTIMIZATION-IF-FALSE*/
        s *= 10;
      }else{
        if( s%10!=0 ) break;                           /*OPTIMIZATION-IF-FALSE*/
        s /= 10;
      }
      e--;
    }

    /* adjust the sign of significand */
    s = sign<0 ? -s : s;

    if( e==0 ){                                         /*OPTIMIZATION-IF-TRUE*/
      result = (double)s;
    }else{
      LONGDOUBLE_TYPE scale = 1.0;
      /* attempt to handle extremely small/large numbers better */
      if( e>307 ){                                      /*OPTIMIZATION-IF-TRUE*/
        if( e<342 ){                                    /*OPTIMIZATION-IF-TRUE*/
          while( e%308 ) { scale *= 1.0e+1; e -= 1; }
          if( esign<0 ){
            result = s / scale;
            result /= 1.0e+308;
          }else{
            result = s * scale;
            result *= 1.0e+308;
          }
        }else{ assert( e>=342 );
          if( esign<0 ){
            result = 0.0*s;
          }else{
            result = 1e308*1e308*s;  /* Infinity */
          }
        }
      }else{
        /* 1.0e+22 is the largest power of 10 than can be 
        ** represented exactly. */
        while( e%22 ) { scale *= 1.0e+1; e -= 1; }
        while( e>0 ) { scale *= 1.0e+22; e -= 22; }
        if( esign<0 ){
          result = s / scale;
        }else{
          result = s * scale;
        }
      }
    }
  }

  /* store the result */
  *pResult = result;

  /* return true if number and no extra non-whitespace chracters after */
  return z==zEnd && nDigits>0 && eValid && nonNum==0;
#else
  return !sqlite3Atoi64(z, pResult, length, enc);
#endif /* SQLITE_OMIT_FLOATING_POINT */
}